

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::attributeDecl(Parser *this,ptr<ObjectExpression> *descriptor,Scope scope)

{
  ObjectExpression *this_00;
  bool bVar1;
  bool bVar2;
  bool constant;
  Identifier identifier;
  ptr<Expression> expr;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  __shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar1 = match(this,Let);
  if (!bVar1) {
    bVar2 = match(this,Const);
    constant = true;
    if (!bVar2) goto LAB_0010c22d;
  }
  consume(this);
  constant = bVar1;
LAB_0010c22d:
  Token::Token((Token *)&expr,&this->currentToken);
  identifier._M_dataplus._M_p = (pointer)&identifier.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi ==
      local_58) {
    identifier.field_2._8_8_ = local_58[0]._8_8_;
  }
  else {
    identifier._M_dataplus._M_p =
         (pointer)expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  local_58[0]._M_local_buf[0] = '\0';
  expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58;
  std::__cxx11::string::~string
            ((string *)&expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  consume(this,Identifier,"identifier");
  consume(this,Assign,"assignment operator \'=\'");
  expression((Parser *)&expr);
  consume(this,StatEnd,"\';\'");
  this_00 = (descriptor->super___shared_ptr<ObjectExpression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>);
  ObjectExpression::putExpression(this_00,&identifier,scope,(ptr<Expression> *)&local_38,constant);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&expr.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&identifier);
  return;
}

Assistant:

void Parser::attributeDecl(ptr<ObjectExpression> &descriptor, Scope scope) {
    bool constant = true;

    if(match(TokenType::Let)) {
        consume();
    } else if(match(TokenType::Const)) {
        constant = false;
        consume();
    }

    Identifier identifier = token().lexeme;
    consume(TokenType::Identifier,"identifier");
    consume(TokenType::Assign, "assignment operator '='");
    ptr<Expression> expr = expression();
    consume(TokenType::StatEnd, "';'");

    descriptor -> putExpression(identifier, scope, expr, constant);
}